

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall
CMU462::StaticScene::AreaLight::AreaLight
          (AreaLight *this,Spectrum *rad,Vector3D *pos,Vector3D *dir,Vector3D *dim_x,Vector3D *dim_y
          )

{
  float fVar1;
  double dVar2;
  double dVar3;
  Vector3D *dim_y_local;
  Vector3D *dim_x_local;
  Vector3D *dir_local;
  Vector3D *pos_local;
  Spectrum *rad_local;
  AreaLight *this_local;
  
  SceneLight::SceneLight(&this->super_SceneLight);
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_00394b38;
  (this->radiance).b = rad->b;
  fVar1 = rad->g;
  (this->radiance).r = rad->r;
  (this->radiance).g = fVar1;
  Vector3D::Vector3D(&this->position,pos);
  Vector3D::Vector3D(&this->direction,dir);
  Vector3D::Vector3D(&this->dim_x,dim_x);
  Vector3D::Vector3D(&this->dim_y,dim_y);
  UniformGridSampler2D::UniformGridSampler2D(&this->sampler);
  dVar2 = Vector3D::norm(dim_x);
  dVar3 = Vector3D::norm(dim_y);
  this->area = (float)(dVar2 * dVar3);
  return;
}

Assistant:

AreaLight::AreaLight(const Spectrum& rad, 
                     const Vector3D& pos,   const Vector3D& dir, 
                     const Vector3D& dim_x, const Vector3D& dim_y)
  : radiance(rad), position(pos), direction(dir),
    dim_x(dim_x), dim_y(dim_y), area(dim_x.norm() * dim_y.norm()) { }